

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitJumpCleanup(ByteCodeGenerator *this,ParseNode *target,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<JumpCleanupInfo> *node;
  JumpCleanupInfo *pJVar4;
  FunctionBody *functionBody;
  ByteCodeWriter *pBVar5;
  JumpCleanupInfo *info;
  Iterator iter;
  FuncInfo *funcInfo_local;
  ParseNode *target_local;
  ByteCodeGenerator *this_local;
  
  iter.current = (NodeBase *)funcInfo;
  DListBase<JumpCleanupInfo,_RealCount>::Iterator::Iterator
            ((Iterator *)&info,&this->jumpCleanupList->super_DListBase<JumpCleanupInfo,_RealCount>);
  while( true ) {
    if (iter.list == (DListBase<JumpCleanupInfo,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pJVar4 = info;
    node = DListNodeBase<JumpCleanupInfo>::Next(&(iter.list)->super_DListNodeBase<JumpCleanupInfo>);
    bVar2 = DListBase<JumpCleanupInfo,_RealCount>::IsHead
                      ((DListBase<JumpCleanupInfo,_RealCount> *)pJVar4,node);
    if (bVar2) break;
    iter.list = (DListBase<JumpCleanupInfo,_RealCount> *)
                DListNodeBase<JumpCleanupInfo>::Next
                          (&(iter.list)->super_DListNodeBase<JumpCleanupInfo>);
    pJVar4 = DListBase<JumpCleanupInfo,_RealCount>::Iterator::Data((Iterator *)&info);
    if (pJVar4->loopNode == (ParseNode *)0x0) {
      if ((((pJVar4->tryOp != TryCatch) && (pJVar4->tryOp != TryFinally)) &&
          (pJVar4->tryOp != TryFinallyWithYield)) &&
         ((pJVar4->tryOp != ResumeCatch && (pJVar4->tryOp != ResumeFinally)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2759,
                           "(info.tryOp == Js::OpCode::TryCatch || info.tryOp == Js::OpCode::TryFinally || info.tryOp == Js::OpCode::TryFinallyWithYield || info.tryOp == Js::OpCode::ResumeCatch || info.tryOp == Js::OpCode::ResumeFinally)"
                           ,
                           "info.tryOp == Js::OpCode::TryCatch || info.tryOp == Js::OpCode::TryFinally || info.tryOp == Js::OpCode::TryFinallyWithYield || info.tryOp == Js::OpCode::ResumeCatch || info.tryOp == Js::OpCode::ResumeFinally"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pBVar5 = Writer(this);
      Js::ByteCodeWriter::Empty(pBVar5,Leave);
    }
    else {
      if (pJVar4->loopNode == target) {
        return;
      }
      functionBody = FuncInfo::GetParsedFunctionBody((FuncInfo *)iter.current);
      bVar2 = Js::DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
      if (bVar2) {
        pBVar5 = Writer(this);
        Js::ByteCodeWriter::Unsigned1(pBVar5,ProfiledLoopEnd,pJVar4->loopId);
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitJumpCleanup(ParseNode* target, FuncInfo* funcInfo)
{
    for (JumpCleanupList::Iterator iter(this->jumpCleanupList); iter.Next();)
    {
        const JumpCleanupInfo& info = iter.Data();

        if (info.loopNode)
        {
            if (info.loopNode == target)
                break;

#if ENABLE_PROFILE_INFO
            if (Js::DynamicProfileInfo::EnableImplicitCallFlags(funcInfo->GetParsedFunctionBody()))
                this->Writer()->Unsigned1(Js::OpCode::ProfiledLoopEnd, info.loopId);
#endif
        }
        else
        {
            Assert(
                info.tryOp == Js::OpCode::TryCatch ||
                info.tryOp == Js::OpCode::TryFinally ||
                info.tryOp == Js::OpCode::TryFinallyWithYield ||
                info.tryOp == Js::OpCode::ResumeCatch ||
                info.tryOp == Js::OpCode::ResumeFinally);

            // We insert OpCode::Leave when there is a 'return' inside try/catch/finally.
            // This is for flow control and does not participate in identifying boundaries 
            // of try/catch blocks, thus we shouldn't call RecordCrossFrameEntryExitRecord
            // here.
            this->Writer()->Empty(Js::OpCode::Leave);
        }
    }
}